

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

int call_init(lua_State *L,GCfunc *fn)

{
  byte bVar1;
  long lVar2;
  int local_50;
  uint local_4c;
  int need;
  int gotparams;
  int numparams;
  GCproto *pt;
  GCfunc *fn_local;
  lua_State *L_local;
  
  if ((fn->c).ffid == '\0') {
    lVar2 = *(long *)((long)fn + 0x20);
    bVar1 = *(byte *)(lVar2 + -0x5e);
    local_50 = (int)((long)L->top - (long)L->base >> 3);
    local_4c = (uint)*(byte *)(lVar2 + -0x5d);
    if ((*(byte *)(lVar2 + -0x2b) & 2) != 0) {
      local_4c = local_50 + 1 + local_4c;
    }
    if ((long)((L->maxstack).ptr64 - (long)L->top) <= (long)((ulong)local_4c * 8)) {
      lj_state_growstack(L,local_4c);
    }
    local_50 = (uint)bVar1 - local_50;
    if (local_50 < 0) {
      local_50 = 0;
    }
    L_local._0_4_ = local_50;
  }
  else {
    if ((long)((L->maxstack).ptr64 - (long)L->top) < 0xa1) {
      lj_state_growstack(L,0x14);
    }
    L_local._0_4_ = 0;
  }
  return (int)L_local;
}

Assistant:

static int call_init(lua_State *L, GCfunc *fn)
{
  if (isluafunc(fn)) {
    GCproto *pt = funcproto(fn);
    int numparams = pt->numparams;
    int gotparams = (int)(L->top - L->base);
    int need = pt->framesize;
    if ((pt->flags & PROTO_VARARG)) need += 1+gotparams;
    lj_state_checkstack(L, (MSize)need);
    numparams -= gotparams;
    return numparams >= 0 ? numparams : 0;
  } else {
    lj_state_checkstack(L, LUA_MINSTACK);
    return 0;
  }
}